

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O3

void __thiscall
ShadingWriter::WriteColorInterpolation
          (ShadingWriter *this,IByteWriter *inWriter,PrimitiveObjectsWriter *inPrimitiveWriter,
          FT_Byte inColorStart,FT_Byte inColorEnd,double inStopDiff)

{
  undefined3 in_register_00000009;
  undefined3 in_register_00000081;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  double local_30;
  
  if (inColorEnd == inColorStart) {
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,(double)inColorEnd / 255.0,eTokenSeparatorSpace);
  }
  else {
    local_50 = local_40;
    local_30 = inStopDiff;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dup ","");
    (*inWriter->_vptr_IByteWriter[2])(inWriter,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,
               (double)(CONCAT31(in_register_00000081,inColorEnd) -
                       CONCAT31(in_register_00000009,inColorStart)) / (local_30 * 255.0),
               eTokenSeparatorSpace);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mul ","");
    (*inWriter->_vptr_IByteWriter[2])(inWriter,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,(double)inColorStart / 255.0,eTokenSeparatorSpace);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"add ","");
    (*inWriter->_vptr_IByteWriter[2])(inWriter,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"exch ","");
  (*inWriter->_vptr_IByteWriter[2])(inWriter,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void ShadingWriter::WriteColorInterpolation(
    IByteWriter* inWriter,
    PrimitiveObjectsWriter* inPrimitiveWriter,
    FT_Byte inColorStart, 
    FT_Byte inColorEnd, 
    double inStopDiff) {
    if(inColorEnd == inColorStart) {
        // same color...so just put it there
        inPrimitiveWriter->WriteDouble(inColorEnd/255.0);
    } else {
        // interpolate
        WriteStreamText(inWriter, "dup ");
        inPrimitiveWriter->WriteDouble((inColorEnd - inColorStart)/(inStopDiff*255.0));
        WriteStreamText(inWriter, "mul ");
        inPrimitiveWriter->WriteDouble(inColorStart/255.0);
        WriteStreamText(inWriter, "add ");
    }
    WriteStreamText(inWriter, "exch ");
}